

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void NextContext(CPpmd7 *p)

{
  CPpmd7_Context *pCVar1;
  CTX_PTR_conflict c;
  CPpmd7 *p_local;
  
  pCVar1 = (CPpmd7_Context *)
           (p->Base + CONCAT22(p->FoundState->SuccessorHigh,p->FoundState->SuccessorLow));
  if ((p->OrderFall == 0) && ((CPpmd7_Context *)p->Text < pCVar1)) {
    p->MaxContext = pCVar1;
    p->MinContext = pCVar1;
  }
  else {
    UpdateModel(p);
  }
  return;
}

Assistant:

static void NextContext(CPpmd8 *p)
{
  CTX_PTR c = CTX(SUCCESSOR(p->FoundState));
  if (p->OrderFall == 0 && (Byte *)c >= p->UnitsStart)
    p->MinContext = p->MaxContext = c;
  else
  {
    UpdateModel(p);
    p->MinContext = p->MaxContext;
  }
}